

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testModule.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  hello_world_t hello_world;
  xmlChar filename [4096];
  code *local_1010;
  undefined1 local_1008 [4096];
  
  local_1010 = (code *)0x0;
  xmlStrPrintf(local_1008,0x1000,"%s/testdso%s",".libs",".so");
  lVar2 = xmlModuleOpen(local_1008,0);
  if (lVar2 == 0) {
    main_cold_3();
  }
  else {
    iVar1 = xmlModuleSymbol(lVar2,"hello_world",&local_1010);
    if (iVar1 == 0) {
      if (local_1010 != (code *)0x0) {
        (*local_1010)();
        xmlModuleClose(lVar2);
        return 0;
      }
      main_cold_2();
    }
    else {
      main_cold_1();
    }
  }
  return 1;
}

Assistant:

int main(int argc ATTRIBUTE_UNUSED, char **argv ATTRIBUTE_UNUSED) {
    xmlChar filename[PATH_MAX];
    xmlModulePtr module = NULL;
    hello_world_t hello_world = NULL;

    /* build the module filename, and confirm the module exists */
    xmlStrPrintf(filename, sizeof(filename),
                 "%s/testdso%s",
                 (const xmlChar*)MODULE_PATH,
                 (const xmlChar*)LIBXML_MODULE_EXTENSION);

    module = xmlModuleOpen((const char*)filename, 0);
    if (module == NULL) {
      fprintf(stderr, "Failed to open module\n");
      return(1);
    }

    if (xmlModuleSymbol(module, "hello_world", (void **) &hello_world)) {
      fprintf(stderr, "Failure to lookup\n");
      return(1);
    }
    if (hello_world == NULL) {
      fprintf(stderr, "Lookup returned NULL\n");
      return(1);
    }

    (*hello_world)();

    xmlModuleClose(module);

    return(0);
}